

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O3

void __thiscall
t_haxe_generator::generate_deserialize_container
          (t_haxe_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Alloc_hider _Var5;
  string i;
  string obj;
  string local_150;
  char *local_130;
  long local_128;
  char local_120 [16];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  local_130 = local_120;
  local_128 = 0;
  local_120[0] = '\0';
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      paVar4 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"_set","");
      t_generator::tmp(&local_150,(t_generator *)this,&local_70);
      std::__cxx11::string::operator=((string *)&local_130,(string *)&local_150);
      _Var5._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
        _Var5._M_p = local_70._M_dataplus._M_p;
      }
      goto LAB_002316f4;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      paVar4 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"_list","");
      t_generator::tmp(&local_150,(t_generator *)this,&local_90);
      std::__cxx11::string::operator=((string *)&local_130,(string *)&local_150);
      _Var5._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p);
        _Var5._M_p = local_90._M_dataplus._M_p;
      }
      goto LAB_002316f4;
    }
  }
  else {
    paVar4 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_map","");
    t_generator::tmp(&local_150,(t_generator *)this,&local_50);
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_150);
    _Var5._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
      _Var5._M_p = local_50._M_dataplus._M_p;
    }
LAB_002316f4:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar4) {
      operator_delete(_Var5._M_p);
    }
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"var ",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_130,local_128);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," = iprot.readSetBegin();",0x18);
      goto LAB_00231810;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"var ",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_130,local_128);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," = iprot.readListBegin();",0x19);
      goto LAB_00231810;
    }
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"var ",4);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_130,local_128);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = iprot.readMapBegin();",0x18);
LAB_00231810:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," = new ",7);
  type_name_abi_cxx11_(&local_150,this,ttype,false,false);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_150._M_dataplus._M_p,local_150._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"_i","");
  t_generator::tmp(&local_150,(t_generator *)this,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"for( ",5);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_150._M_dataplus._M_p,local_150._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," in 0 ... ",10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_130,local_128);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,".size)",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      paVar4 = &local_f0.field_2;
      pcVar1 = (prefix->_M_dataplus)._M_p;
      local_f0._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,pcVar1,pcVar1 + prefix->_M_string_length);
      generate_deserialize_set_element(this,out,(t_set *)ttype,&local_f0);
      _Var5._M_p = local_f0._M_dataplus._M_p;
      goto LAB_00231a99;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      paVar4 = &local_110.field_2;
      pcVar1 = (prefix->_M_dataplus)._M_p;
      local_110._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar1,pcVar1 + prefix->_M_string_length);
      generate_deserialize_list_element(this,out,(t_list *)ttype,&local_110);
      _Var5._M_p = local_110._M_dataplus._M_p;
      goto LAB_00231a99;
    }
  }
  else {
    paVar4 = &local_d0.field_2;
    pcVar1 = (prefix->_M_dataplus)._M_p;
    local_d0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + prefix->_M_string_length);
    generate_deserialize_map_element(this,out,(t_map *)ttype,&local_d0);
    _Var5._M_p = local_d0._M_dataplus._M_p;
LAB_00231a99:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar4) {
      operator_delete(_Var5._M_p);
    }
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar2 == '\0') goto LAB_00231b58;
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"iprot.readListEnd();",0x14);
    }
    else {
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"iprot.readSetEnd();",0x13);
    }
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"iprot.readMapEnd();",0x13);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_00231b58:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if (local_130 != local_120) {
    operator_delete(local_130);
  }
  return;
}

Assistant:

void t_haxe_generator::generate_deserialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  string obj;

  if (ttype->is_map()) {
    obj = tmp("_map");
  } else if (ttype->is_set()) {
    obj = tmp("_set");
  } else if (ttype->is_list()) {
    obj = tmp("_list");
  }

  // Declare variables, read header
  if (ttype->is_map()) {
    indent(out) << "var " << obj << " = iprot.readMapBegin();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "var " << obj << " = iprot.readSetBegin();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "var " << obj << " = iprot.readListBegin();" << endl;
  }

  indent(out) << prefix << " = new " << type_name(ttype, false, true)
              // size the collection correctly
              << "("
              << ");" << endl;

  // For loop iterates over elements
  string i = tmp("_i");
  indent(out) << "for( " << i << " in 0 ... " << obj << ".size)" << endl;

  scope_up(out);

  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix);
  }

  scope_down(out);

  // Read container end
  if (ttype->is_map()) {
    indent(out) << "iprot.readMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "iprot.readSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "iprot.readListEnd();" << endl;
  }

  scope_down(out);
}